

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_info.hpp
# Opt level: O3

string * __thiscall
duckdb::CreateInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateInfo *this)

{
  NotImplementedException *this_00;
  char *pcVar1;
  allocator local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"ToString not supported for this type of CreateInfo: \'%s\'","");
  pcVar1 = EnumUtil::ToChars<duckdb::ParseInfoType>((this->super_ParseInfo).info_type);
  ::std::__cxx11::string::string((string *)&local_40,pcVar1,&local_61);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_60,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

virtual string ToString() const {
		throw NotImplementedException("ToString not supported for this type of CreateInfo: '%s'",
		                              EnumUtil::ToString(info_type));
	}